

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItemPrivate::updateSceneTransformFromParent(QGraphicsItemPrivate *this)

{
  double dVar1;
  double dVar2;
  QGraphicsItemPrivate *pQVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  TransformData *this_00;
  QTransform *pQVar7;
  QTransform *pQVar8;
  QTransform *pQVar9;
  long in_FS_OFFSET;
  byte bVar10;
  QTransform QStack_88;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->parent == (QGraphicsItem *)0x0) {
    this_00 = this->transformData;
    if (this_00 == (TransformData *)0x0) {
      QTransform::fromTranslate((this->pos).xp,(this->pos).yp);
      pQVar7 = &QStack_88;
      pQVar8 = &this->sceneTransform;
      for (lVar5 = 0x4a; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined1 *)pQVar8->m_matrix[0] = *(undefined1 *)pQVar7;
        pQVar7 = (QTransform *)((long)pQVar7 + (ulong)bVar10 * -2 + 1);
        pQVar8 = (QTransform *)((long)pQVar8 + (ulong)bVar10 * -2 + 1);
      }
      uVar6 = *(ulong *)&this->field_0x160 | 0x4000000000000000;
      goto LAB_0057083f;
    }
    if (this_00->onlyTransform != true) {
      dVar1 = (this->pos).xp;
      dVar2 = (this->pos).yp;
      pQVar7 = &this->sceneTransform;
      if ((((dVar1 == 0.0) && (!NAN(dVar1))) && (dVar2 == 0.0)) && (!NAN(dVar2))) {
        TransformData::computedFullTransform(&QStack_88,this_00,(QTransform *)0x0);
        pQVar8 = &QStack_88;
        for (lVar5 = 0x4a; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined1 *)pQVar7->m_matrix[0] = *(undefined1 *)pQVar8;
          pQVar8 = (QTransform *)((long)pQVar8 + (ulong)bVar10 * -2 + 1);
          pQVar7 = (QTransform *)((long)pQVar7 + (ulong)bVar10 * -2 + 1);
        }
        iVar4 = QTransform::type();
        uVar6 = 0x4000000000000000;
        if (1 < iVar4) {
          uVar6 = 0;
        }
        goto LAB_00570805;
      }
      QTransform::fromTranslate(dVar1,dVar2);
      pQVar8 = &QStack_88;
      pQVar9 = pQVar7;
      for (lVar5 = 0x4a; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined1 *)pQVar9->m_matrix[0] = *(undefined1 *)pQVar8;
        pQVar8 = (QTransform *)((long)pQVar8 + (ulong)bVar10 * -2 + 1);
        pQVar9 = (QTransform *)((long)pQVar9 + (ulong)bVar10 * -2 + 1);
      }
      TransformData::computedFullTransform(&QStack_88,this->transformData,pQVar7);
      goto LAB_005707ce;
    }
    pQVar7 = &this->sceneTransform;
    for (lVar5 = 0x4a; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined1 *)pQVar7->m_matrix[0] = *(undefined1 *)(this_00->transform).m_matrix[0];
      this_00 = (TransformData *)((long)(this_00->transform).m_matrix[0] + 1);
      pQVar7 = (QTransform *)((long)pQVar7->m_matrix[0] + 1);
    }
    dVar1 = (this->pos).xp;
    dVar2 = (this->pos).yp;
    if (((dVar1 != 0.0) || (NAN(dVar1))) || ((dVar2 != 0.0 || (NAN(dVar2))))) {
      QTransform::fromTranslate(dVar1,dVar2);
      QTransform::operator*=(&this->sceneTransform,&QStack_88);
    }
  }
  else {
    pQVar3 = (this->parent->d_ptr).d;
    if ((*(ulong *)&pQVar3->field_0x160 & 0x4000000000000000) == 0) {
      pQVar7 = &pQVar3->sceneTransform;
      pQVar8 = &this->sceneTransform;
      for (lVar5 = 0x4a; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined1 *)pQVar8->m_matrix[0] = *(undefined1 *)pQVar7->m_matrix[0];
        pQVar7 = (QTransform *)((long)pQVar7->m_matrix[0] + 1);
        pQVar8 = (QTransform *)((long)pQVar8->m_matrix[0] + 1);
      }
      QTransform::translate((this->pos).xp,(this->pos).yp);
    }
    else {
      QTransform::fromTranslate
                ((pQVar3->sceneTransform).m_matrix[2][0] + (this->pos).xp,
                 (pQVar3->sceneTransform).m_matrix[2][1] + (this->pos).yp);
      pQVar7 = &QStack_88;
      pQVar8 = &this->sceneTransform;
      for (lVar5 = 0x4a; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined1 *)pQVar8->m_matrix[0] = *(undefined1 *)pQVar7;
        pQVar7 = (QTransform *)((long)pQVar7 + (ulong)bVar10 * -2 + 1);
        pQVar8 = (QTransform *)((long)pQVar8 + (ulong)bVar10 * -2 + 1);
      }
    }
    if (this->transformData == (TransformData *)0x0) {
      uVar6 = *(ulong *)&((this->parent->d_ptr).d)->field_0x160 & 0x4000000000000000;
LAB_00570805:
      uVar6 = *(ulong *)&this->field_0x160 & 0xbfffffffffffffff | uVar6;
      goto LAB_0057083f;
    }
    TransformData::computedFullTransform(&QStack_88,this->transformData,&this->sceneTransform);
LAB_005707ce:
    pQVar7 = &QStack_88;
    pQVar8 = &this->sceneTransform;
    for (lVar5 = 0x4a; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined1 *)pQVar8->m_matrix[0] = *(undefined1 *)pQVar7;
      pQVar7 = (QTransform *)((long)pQVar7 + (ulong)bVar10 * -2 + 1);
      pQVar8 = (QTransform *)((long)pQVar8 + (ulong)bVar10 * -2 + 1);
    }
  }
  iVar4 = QTransform::type();
  uVar6 = 0;
  if (iVar4 < 2) {
    uVar6 = 0x4000000000000000;
  }
  uVar6 = *(ulong *)&this->field_0x160 & 0xbfffffffffffffff | uVar6;
LAB_0057083f:
  *(ulong *)&this->field_0x160 = uVar6 & 0xffdfffffffffffff;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::updateSceneTransformFromParent()
{
    if (parent) {
        Q_ASSERT(!parent->d_ptr->dirtySceneTransform);
        if (parent->d_ptr->sceneTransformTranslateOnly) {
            sceneTransform = QTransform::fromTranslate(parent->d_ptr->sceneTransform.dx() + pos.x(),
                                                       parent->d_ptr->sceneTransform.dy() + pos.y());
        } else {
            sceneTransform = parent->d_ptr->sceneTransform;
            sceneTransform.translate(pos.x(), pos.y());
        }
        if (transformData) {
            sceneTransform = transformData->computedFullTransform(&sceneTransform);
            sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
        } else {
            sceneTransformTranslateOnly = parent->d_ptr->sceneTransformTranslateOnly;
        }
    } else if (!transformData) {
        sceneTransform = QTransform::fromTranslate(pos.x(), pos.y());
        sceneTransformTranslateOnly = 1;
    } else if (transformData->onlyTransform) {
        sceneTransform = transformData->transform;
        if (!pos.isNull())
            sceneTransform *= QTransform::fromTranslate(pos.x(), pos.y());
        sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
    } else if (pos.isNull()) {
        sceneTransform = transformData->computedFullTransform();
        sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
    } else {
        sceneTransform = QTransform::fromTranslate(pos.x(), pos.y());
        sceneTransform = transformData->computedFullTransform(&sceneTransform);
        sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
    }
    dirtySceneTransform = 0;
}